

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O2

string * __thiscall
version_struct::to_string_abi_cxx11_(string *__return_storage_ptr__,version_struct *this)

{
  char v_str [128];
  allocator local_99;
  char local_98 [136];
  
  snprintf(local_98,0x80,"%d.%d.%d",(ulong)(uint)this->major,(ulong)(uint)this->minor,
           (ulong)(uint)this->rev);
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_98,&local_99);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const
  {
    char v_str[128];
    sprintf_s(v_str, sizeof(v_str), "%d.%d.%d", major, minor, rev);
    std::string s = v_str;
    return s;
  }